

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

void Simple::get_http_11_invoker(void)

{
  undefined8 uVar1;
  ostringstream local_240 [112];
  ios_base local_1d0 [264];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  undefined7 uStack_57;
  long local_48 [2];
  get_http_11 local_31 [8];
  get_http_11 t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_a0 = "";
  memset(local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_c0 = 0;
  local_b8 = 0;
  local_58 = (string)0x22;
  local_c8 = &local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"get_http_11",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_58);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a8,0x45);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::ios_base::~ios_base(local_1d0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_90 = "";
  memset(local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_c0 = 0;
  local_b8 = 0;
  local_58 = (string)0x22;
  local_c8 = &local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"get_http_11",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_58);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0x45);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::ios_base::~ios_base(local_1d0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_80 = "";
  memset(local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_c0 = 0;
  local_b8 = 0;
  local_58 = (string)0x22;
  local_c8 = &local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"get_http_11",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_58);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_88,0x45);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::ios_base::~ios_base(local_1d0);
  get_http_11::test_method(local_31);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_70 = "";
  memset(local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_c0 = 0;
  local_b8 = 0;
  local_58 = (string)0x22;
  local_c8 = &local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"get_http_11",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_240,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_58);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_78,0x45);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::ios_base::~ios_base(local_1d0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_60 = "";
  memset(local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_c0 = 0;
  local_b8 = 0;
  local_58 = (string)0x22;
  local_c8 = &local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"get_http_11",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_58);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x45);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::ios_base::~ios_base(local_1d0);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(get_http_11, RequestFixture)
{
    const char *text = "GET /uri HTTP/1.1\r\n\r\n";
    Request result = parse(text);
    Request should = RequestDsl()
            .method("GET")
            .uri("/uri")
            .version(1, 1)
            .keepAlive(true);
    
    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}